

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * __thiscall pugi::xml_node::child_value(xml_node *this)

{
  xml_node_struct *pxVar1;
  
  pxVar1 = this->_root;
  if (pxVar1 != (xml_node_struct *)0x0) {
    if (((pxVar1->header & 0xf) == 2) && (pxVar1->value != (char_t *)0x0)) {
      return pxVar1->value;
    }
    for (pxVar1 = pxVar1->first_child; pxVar1 != (xml_node_struct *)0x0;
        pxVar1 = pxVar1->next_sibling) {
      if (pxVar1->value != (char_t *)0x0 && ((uint)pxVar1->header & 0xf) - 3 < 2) {
        return pxVar1->value;
      }
    }
  }
  return "";
}

Assistant:

PUGI_IMPL_FN const char_t* xml_node::child_value() const
	{
		if (!_root) return PUGIXML_TEXT("");

		// element nodes can have value if parse_embed_pcdata was used
		if (PUGI_IMPL_NODETYPE(_root) == node_element && _root->value)
			return _root->value;

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
		{
			const char_t* ivalue = i->value;
			if (impl::is_text_node(i) && ivalue)
				return ivalue;
		}

		return PUGIXML_TEXT("");
	}